

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

void freeDTDrawingParameters(DTDrawingParameters *DTDparams)

{
  DTDrawingParameters *DTDparams_local;
  
  if (DTDparams != (DTDrawingParameters *)0x0) {
    if (DTDparams->divideLinesPoints != (GLfloat (*) [2])0x0) {
      free(DTDparams->divideLinesPoints);
    }
    if (DTDparams->divideLinesDraw != (bov_points_t *)0x0) {
      bov_points_delete(DTDparams->divideLinesDraw);
    }
    if (DTDparams->divideLinesMask != (char *)0x0) {
      free(DTDparams->divideLinesMask);
    }
    if (DTDparams->searchPointsDraw != (bov_points_t *)0x0) {
      bov_points_delete(DTDparams->searchPointsDraw);
    }
    if (DTDparams->circlePointsDraw != (bov_points_t *)0x0) {
      bov_points_delete(DTDparams->circlePointsDraw);
    }
    if (DTDparams->searchPointsOrder != (bov_order_t *)0x0) {
      bov_order_delete(DTDparams->searchPointsOrder);
    }
    free(DTDparams);
  }
  return;
}

Assistant:

void freeDTDrawingParameters(DTDrawingParameters *DTDparams) {
	if (DTDparams != NULL) {
		if (DTDparams->divideLinesPoints != NULL) free(DTDparams->divideLinesPoints);
		if (DTDparams->divideLinesDraw != NULL) bov_points_delete(DTDparams->divideLinesDraw);
		if (DTDparams->divideLinesMask != NULL) free(DTDparams->divideLinesMask);
		if (DTDparams->searchPointsDraw != NULL) bov_points_delete(DTDparams->searchPointsDraw);
		if (DTDparams->circlePointsDraw != NULL) bov_points_delete(DTDparams->circlePointsDraw);
		if (DTDparams->searchPointsOrder != NULL) bov_order_delete(DTDparams->searchPointsOrder);
		free(DTDparams);
	}
}